

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleColor(ImGuiCol idx,ImU32 col)

{
  ImVec4 *pIVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  ImVec4 IVar6;
  ImGuiColorMod local_2c;
  undefined1 auVar5 [56];
  
  pIVar3 = GImGui;
  pIVar1 = (GImGui->Style).Colors + idx;
  local_2c.BackupValue.x = pIVar1->x;
  local_2c.BackupValue.y = pIVar1->y;
  local_2c.BackupValue.z = pIVar1->z;
  local_2c.BackupValue.w = pIVar1->w;
  auVar5 = ZEXT856((ulong)local_2c.BackupValue._8_8_);
  local_2c.Col = idx;
  ImVector<ImGuiColorMod>::push_back(&GImGui->ColorStack,&local_2c);
  IVar6 = ColorConvertU32ToFloat4(col);
  auVar4._0_8_ = IVar6._0_8_;
  auVar4._8_56_ = auVar5;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = IVar6._8_8_;
  IVar6 = (ImVec4)vmovlhps_avx(auVar4._0_16_,auVar2);
  (pIVar3->Style).Colors[idx] = IVar6;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, ImU32 col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColorMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorStack.push_back(backup);
    g.Style.Colors[idx] = ColorConvertU32ToFloat4(col);
}